

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

Clump * rw::Clump::streamRead(Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  Clump *this;
  FrameList_ *pFVar4;
  size_t sz_00;
  Geometry *pGVar5;
  Light *this_00;
  Camera *this_01;
  int local_104;
  int local_100;
  int32 i_5;
  int32 i_4;
  Error _e_10;
  Error _e_9;
  int32 i_3;
  Camera *cam;
  undefined4 local_d8;
  Error _e_8;
  Error _e_7;
  int32 i_2;
  Light *l;
  int32 frm;
  Error _e_6;
  int32 i_1;
  Atomic *a;
  undefined4 local_a0;
  Error _e_5;
  int32 i;
  Error _e_4;
  size_t sz;
  Error _e_3;
  Error _e_2;
  Error _e_1;
  FrameList_ frmlst;
  int local_58;
  int32 numCameras;
  int32 numLights;
  int32 numAtomics;
  Error _e;
  Geometry **geometryList;
  int32 numGeometries;
  Clump *clump;
  int local_28;
  int32 buf [3];
  uint32 version;
  uint32 length;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)(buf + 2),(uint32 *)(buf + 1));
  if (!bVar2) {
    numLights = 2;
    numAtomics = -0x7ffffffc;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0x9d);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar3);
    setError((Error *)&numLights);
    return (Clump *)0x0;
  }
  Stream::read32(stream,(void *)((long)&clump + 4),buf[2]);
  local_58 = 0;
  frmlst.frames._4_4_ = 0;
  if (0x33000 < (uint)buf[1]) {
    local_58 = local_28;
    frmlst.frames._4_4_ = buf[0];
  }
  this = create();
  if (this == (Clump *)0x0) {
    return (Clump *)0x0;
  }
  bVar2 = findChunk(stream,0xe,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    pFVar4 = FrameList_::streamRead((FrameList_ *)&_e_1,stream);
    if (pFVar4 != (FrameList_ *)0x0) {
      setFrame(this,pFRam0000000000000000);
      geometryList._4_4_ = 0;
      _e.plugin = 0;
      _e.code = 0;
      if (0x303ff < (uint)buf[1]) {
        bVar2 = findChunk(stream,0x1a,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          _e_3.plugin = 2;
          _e_3.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xbc
                 );
          pFVar1 = _stderr;
          pcVar3 = dbgsprint(0x80000004,"GEOMETRYLIST");
          fprintf(pFVar1,"%s\n",pcVar3);
          setError(&_e_3);
          goto LAB_0014a4a2;
        }
        bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          sz._0_4_ = 2;
          sz._4_4_ = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xc0
                 );
          pFVar1 = _stderr;
          pcVar3 = dbgsprint(0x80000004,"STRUCT");
          fprintf(pFVar1,"%s\n",pcVar3);
          setError((Error *)&sz);
          goto LAB_0014a4a2;
        }
        geometryList._4_4_ = Stream::readI32(stream);
        if (geometryList._4_4_ != 0) {
          sz_00 = (long)geometryList._4_4_ << 3;
          _e = (Error)malloc_LOC(sz_00,0x10010,
                                 "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp line: 198"
                                );
          if (_e == (Error)0x0) {
            _e_5.code = 2;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",
                    200);
            pFVar1 = _stderr;
            pcVar3 = dbgsprint(0x80000002,sz_00);
            fprintf(pFVar1,"%s\n",pcVar3);
            setError((Error *)&_e_5.code);
            goto LAB_0014a4a2;
          }
          memset((void *)_e,0,sz_00);
        }
        for (_e_5.plugin = 0; (int)_e_5.plugin < geometryList._4_4_; _e_5.plugin = _e_5.plugin + 1)
        {
          bVar2 = findChunk(stream,0xf,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar2) {
            a._4_4_ = 2;
            local_a0 = 0x80000004;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",
                    0xcf);
            pFVar1 = _stderr;
            pcVar3 = dbgsprint(0x80000004,"GEOMETRY");
            fprintf(pFVar1,"%s\n",pcVar3);
            setError((Error *)((long)&a + 4));
            goto LAB_0014a443;
          }
          pGVar5 = Geometry::streamRead(stream);
          *(Geometry **)((long)_e + (long)(int)_e_5.plugin * 8) = pGVar5;
          if (*(long *)((long)_e + (long)(int)_e_5.plugin * 8) == 0) goto LAB_0014a443;
        }
      }
      for (_e_6.plugin = 0; (int)_e_6.plugin < clump._4_4_; _e_6.plugin = _e_6.plugin + 1) {
        bVar2 = findChunk(stream,0x14,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          l._4_4_ = 2;
          frm = -0x7ffffffc;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xdc
                 );
          pFVar1 = _stderr;
          pcVar3 = dbgsprint(0x80000004,"ATOMIC");
          fprintf(pFVar1,"%s\n",pcVar3);
          setError((Error *)((long)&l + 4));
          goto LAB_0014a443;
        }
        register0x00000000 = Atomic::streamReadClump(stream,(FrameList_ *)&_e_1,(Geometry **)_e);
        if (register0x00000000 == (Atomic *)0x0) goto LAB_0014a443;
        addAtomic(this,register0x00000000);
      }
      for (_e_7.plugin = 0; (int)_e_7.plugin < local_58; _e_7.plugin = _e_7.plugin + 1) {
        bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          _e_8.plugin = 2;
          _e_8.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xea
                 );
          pFVar1 = _stderr;
          pcVar3 = dbgsprint(0x80000004,"STRUCT");
          fprintf(pFVar1,"%s\n",pcVar3);
          setError(&_e_8);
          goto LAB_0014a443;
        }
        l._0_4_ = Stream::readI32(stream);
        bVar2 = findChunk(stream,0x12,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          cam._4_4_ = 2;
          local_d8 = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xef
                 );
          pFVar1 = _stderr;
          pcVar3 = dbgsprint(0x80000004,"LIGHT");
          fprintf(pFVar1,"%s\n",pcVar3);
          setError((Error *)((long)&cam + 4));
          goto LAB_0014a443;
        }
        this_00 = Light::streamRead(stream);
        if (this_00 == (Light *)0x0) goto LAB_0014a443;
        Light::setFrame(this_00,*(Frame **)((long)(int32)l * 8));
        addLight(this,this_00);
      }
      for (_e_9.plugin = 0; (int)_e_9.plugin < frmlst.frames._4_4_; _e_9.plugin = _e_9.plugin + 1) {
        bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          _e_10.plugin = 2;
          _e_10.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xfd
                 );
          pFVar1 = _stderr;
          pcVar3 = dbgsprint(0x80000004,"STRUCT");
          fprintf(pFVar1,"%s\n",pcVar3);
          setError(&_e_10);
          goto LAB_0014a443;
        }
        l._0_4_ = Stream::readI32(stream);
        bVar2 = findChunk(stream,5,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          i_5 = 2;
          i_4 = -0x7ffffffc;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",
                  0x102);
          pFVar1 = _stderr;
          pcVar3 = dbgsprint(0x80000004,"CAMERA");
          fprintf(pFVar1,"%s\n",pcVar3);
          setError((Error *)&i_5);
          goto LAB_0014a443;
        }
        this_01 = Camera::streamRead(stream);
        if (this_01 == (Camera *)0x0) goto LAB_0014a443;
        Camera::setFrame(this_01,*(Frame **)((long)(int32)l * 8));
        addCamera(this,this_01);
      }
      for (local_100 = 0; local_100 < geometryList._4_4_; local_100 = local_100 + 1) {
        if (*(long *)((long)_e + (long)local_100 * 8) != 0) {
          Geometry::destroy(*(Geometry **)((long)_e + (long)local_100 * 8));
        }
      }
      (*DAT_001685f8)(_e);
      (*DAT_001685f8)(0);
      bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
      if (bVar2) {
        return this;
      }
LAB_0014a443:
      for (local_104 = 0; local_104 < geometryList._4_4_; local_104 = local_104 + 1) {
        if (*(long *)((long)_e + (long)local_104 * 8) != 0) {
          Geometry::destroy(*(Geometry **)((long)_e + (long)local_104 * 8));
        }
      }
      (*DAT_001685f8)(_e);
    }
  }
  else {
    _e_2.plugin = 2;
    _e_2.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xb0);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x80000004,"FRAMELIST");
    fprintf(pFVar1,"%s\n",pcVar3);
    setError(&_e_2);
  }
LAB_0014a4a2:
  (*DAT_001685f8)(0);
  destroy(this);
  return (Clump *)0x0;
}

Assistant:

Clump*
Clump::streamRead(Stream *stream)
{
	uint32 length, version;
	int32 buf[3];
	Clump *clump;
	int32 numGeometries;
	Geometry **geometryList;

	if(!findChunk(stream, ID_STRUCT, &length, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(buf, length);
	int32 numAtomics = buf[0];
	int32 numLights = 0;
	int32 numCameras = 0;
	if(version > 0x33000){
		numLights = buf[1];
		numCameras = buf[2];
	}
	clump = Clump::create();
	if(clump == nil)
		return nil;

	// Frame list
	FrameList_ frmlst;
	frmlst.frames = nil;
	if(!findChunk(stream, ID_FRAMELIST, nil, nil)){
		RWERROR((ERR_CHUNK, "FRAMELIST"));
		goto fail;
	}
	if(frmlst.streamRead(stream) == nil)
		goto fail;
	clump->setFrame(frmlst.frames[0]);

	// Geometry list
	numGeometries = 0;
	geometryList = nil;
	if(version >= 0x30400){
		if(!findChunk(stream, ID_GEOMETRYLIST, nil, nil)){
			RWERROR((ERR_CHUNK, "GEOMETRYLIST"));
			goto fail;
		}
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto fail;
		}
		numGeometries = stream->readI32();
		if(numGeometries){
			size_t sz = numGeometries*sizeof(Geometry*);
			geometryList = (Geometry**)rwMalloc(sz, MEMDUR_FUNCTION | ID_CLUMP);
			if(geometryList == nil){
				RWERROR((ERR_ALLOC, sz));
				goto fail;
			}
			memset(geometryList, 0, sz);
		}
		for(int32 i = 0; i < numGeometries; i++){
			if(!findChunk(stream, ID_GEOMETRY, nil, nil)){
				RWERROR((ERR_CHUNK, "GEOMETRY"));
				goto failgeo;
			}
			geometryList[i] = Geometry::streamRead(stream);
			if(geometryList[i] == nil)
				goto failgeo;
		}
	}

	// Atomics
	Atomic *a;
	for(int32 i = 0; i < numAtomics; i++){
		if(!findChunk(stream, ID_ATOMIC, nil, nil)){
			RWERROR((ERR_CHUNK, "ATOMIC"));
			goto failgeo;
		}
		a = Atomic::streamReadClump(stream, &frmlst, geometryList);
		if(a == nil)
			goto failgeo;
		clump->addAtomic(a);
	}

	// Lights
	int32 frm;
	Light *l;
	for(int32 i = 0; i < numLights; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_LIGHT, nil, nil)){
			RWERROR((ERR_CHUNK, "LIGHT"));
			goto failgeo;
		}
		l = Light::streamRead(stream);
		if(l == nil)
			goto failgeo;
		l->setFrame(frmlst.frames[frm]);
		clump->addLight(l);
	}

	// Cameras
	Camera *cam;
	for(int32 i = 0; i < numCameras; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_CAMERA, nil, nil)){
			RWERROR((ERR_CHUNK, "CAMERA"));
			goto failgeo;
		}
		cam = Camera::streamRead(stream);
		if(cam == nil)
			goto failgeo;
		cam->setFrame(frmlst.frames[frm]);
		clump->addCamera(cam);
	}

	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
	rwFree(frmlst.frames);
	if(s_plglist.streamRead(stream, clump))
		return clump;

failgeo:
	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
fail:
	rwFree(frmlst.frames);
	clump->destroy();
	return nil;
}